

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall
jsonnet::internal::Object::Object
          (Object *this,LocationRange *lr,Fodder *open_fodder,ObjectFields *fields,
          bool trailing_comma,Fodder *close_fodder)

{
  pointer pOVar1;
  pointer pOVar2;
  long lVar3;
  
  AST::AST(&this->super_AST,lr,AST_OBJECT,open_fodder);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__Object_0022bef0;
  std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
  vector(&this->fields,fields);
  this->trailingComma = trailing_comma;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->closeFodder,close_fodder);
  pOVar1 = (fields->
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (fields->
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pOVar2 - (long)pOVar1;
  if (trailing_comma && lVar3 == 0) {
    __assert_fail("fields.size() > 0 || !trailing_comma",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                  0x321,
                  "jsonnet::internal::Object::Object(const LocationRange &, const Fodder &, const ObjectFields &, bool, const Fodder &)"
                 );
  }
  if ((pOVar2 != pOVar1 && !trailing_comma) &&
     (*(long *)((long)pOVar1 + lVar3 + -0x10) != *(long *)((long)pOVar1 + lVar3 + -0x18))) {
    __assert_fail("trailing_comma || fields[fields.size() - 1].commaFodder.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                  0x323,
                  "jsonnet::internal::Object::Object(const LocationRange &, const Fodder &, const ObjectFields &, bool, const Fodder &)"
                 );
  }
  return;
}

Assistant:

Object(const LocationRange &lr, const Fodder &open_fodder, const ObjectFields &fields,
           bool trailing_comma, const Fodder &close_fodder)
        : AST(lr, AST_OBJECT, open_fodder),
          fields(fields),
          trailingComma(trailing_comma),
          closeFodder(close_fodder)
    {
        assert(fields.size() > 0 || !trailing_comma);
        if (fields.size() > 0)
            assert(trailing_comma || fields[fields.size() - 1].commaFodder.size() == 0);
    }